

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cea708.c
# Opt level: O0

int cea708_init(cea708_t *cea708,double timestamp)

{
  undefined4 *in_RDI;
  undefined8 in_XMM0_Qa;
  
  memset(in_RDI,0,0xa0);
  *in_RDI = 0xb5;
  in_RDI[1] = 0x31;
  in_RDI[2] = 0x47413934;
  *(undefined1 *)(in_RDI + 3) = 3;
  *(undefined1 *)((long)in_RDI + 0xd) = 0;
  *(ushort *)(in_RDI + 4) = *(ushort *)(in_RDI + 4) & 0xfffe;
  *(ushort *)(in_RDI + 4) = *(ushort *)(in_RDI + 4) & 0xfffd | 2;
  *(ushort *)(in_RDI + 4) = *(ushort *)(in_RDI + 4) & 0xfffb;
  *(ushort *)(in_RDI + 4) = *(ushort *)(in_RDI + 4) & 0xff | 0xff00;
  *(ushort *)(in_RDI + 4) = *(ushort *)(in_RDI + 4) & 0xff07;
  *(undefined8 *)(in_RDI + 0x26) = in_XMM0_Qa;
  return 1;
}

Assistant:

int cea708_init(cea708_t* cea708, double timestamp)
{
    memset(cea708, 0, sizeof(cea708_t));
    cea708->country = country_united_states;
    cea708->provider = t35_provider_atsc;
    cea708->user_identifier = GA94;
    cea708->user_data_type_code = 3;
    cea708->directv_user_data_length = 0;
    cea708->user_data.process_em_data_flag = 0;
    cea708->user_data.process_cc_data_flag = 1;
    cea708->user_data.additional_data_flag = 0;
    cea708->user_data.em_data = 0xFF;
    cea708->user_data.cc_count = 0;
    cea708->timestamp = timestamp;
    return 1;
}